

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O1

void __thiscall
asmjit::RAAssignment::swap
          (RAAssignment *this,uint32_t group,uint32_t aWorkId,uint32_t aPhysId,uint32_t bWorkId,
          uint32_t bPhysId)

{
  ZoneVectorBase *this_00;
  PhysToWorkMap **this_01;
  WorkToPhysMap *pWVar1;
  uint32_t *puVar2;
  PhysToWorkMap *pPVar3;
  undefined8 *__src;
  Error EVar4;
  uint uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  uint extraout_EDX;
  uint uVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  ZoneAllocator *pZVar10;
  ZoneAllocator *allocator;
  RAAssignment *this_02;
  RAAssignment *this_03;
  bool bVar11;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  
  pZVar10 = (ZoneAllocator *)CONCAT44(in_register_00000034,group);
  puVar6 = (uint32_t *)(ulong)aPhysId;
  if (aPhysId == bPhysId) {
    swap();
LAB_0011ed01:
    swap();
LAB_0011ed06:
    swap();
LAB_0011ed0b:
    swap();
LAB_0011ed10:
    swap();
LAB_0011ed15:
    swap();
LAB_0011ed1a:
    swap();
LAB_0011ed1f:
    swap();
LAB_0011ed24:
    swap();
LAB_0011ed29:
    swap();
LAB_0011ed2e:
    swap();
LAB_0011ed33:
    swap();
LAB_0011ed38:
    swap();
  }
  else {
    if (aWorkId == 0xffffffff) goto LAB_0011ed01;
    uVar5 = (this->_layout).workCount;
    puVar6 = (uint32_t *)(ulong)uVar5;
    if (uVar5 <= aWorkId) goto LAB_0011ed06;
    pWVar1 = this->_workToPhysMap;
    if (pWVar1[aWorkId].physIds[0] != aPhysId) goto LAB_0011ed0b;
    if (bWorkId == 0xffffffff) goto LAB_0011ed10;
    if (uVar5 <= bWorkId) goto LAB_0011ed15;
    puVar6 = (uint32_t *)(ulong)pWVar1[bWorkId].physIds[0];
    if (pWVar1[bWorkId].physIds[0] != bPhysId) goto LAB_0011ed1a;
    if (0x1f < aPhysId) goto LAB_0011ed1f;
    puVar6 = this->_physToWorkIds[group];
    if (puVar6[aPhysId] != aWorkId) goto LAB_0011ed24;
    if (0x1f < bPhysId) goto LAB_0011ed29;
    if (puVar6[bPhysId] != bWorkId) goto LAB_0011ed2e;
    if (3 < group) goto LAB_0011ed33;
    uVar5 = (this->_physToWorkMap->assigned)._masks[group];
    pZVar10 = (ZoneAllocator *)0x1;
    puVar6 = (uint32_t *)(ulong)aPhysId;
    uVar8 = 1 << ((byte)aPhysId & 0x1f);
    if ((uVar5 >> (aPhysId & 0x1f) & 1) == 0) goto LAB_0011ed38;
    puVar6 = (uint32_t *)(ulong)bPhysId;
    uVar9 = 1 << ((byte)bPhysId & 0x1f);
    pZVar10 = (ZoneAllocator *)(ulong)uVar9;
    if ((uVar5 >> (bPhysId & 0x1f) & 1) != 0) {
      pWVar1[aWorkId].physIds[0] = (byte)bPhysId;
      this->_workToPhysMap[bWorkId].physIds[0] = (byte)aPhysId;
      puVar6 = this->_physToWorkIds[group];
      puVar6[aPhysId] = bWorkId;
      puVar6[bPhysId] = aWorkId;
      uVar5 = (this->_physToWorkMap->dirty)._masks[group];
      bVar11 = ((uVar5 & uVar9) != 0) != ((uVar5 & uVar8) != 0);
      uVar9 = uVar9 | uVar8;
      uVar8 = 0;
      if (bVar11) {
        uVar8 = uVar9;
      }
      (this->_physToWorkMap->dirty)._masks[group] = uVar8 ^ uVar5;
      verify(this,(EVP_PKEY_CTX *)(ulong)uVar9,(uchar *)(ulong)(uVar8 ^ uVar5),(ulong)uVar5,
             (uchar *)CONCAT44(in_register_00000084,CONCAT31((int3)(bWorkId >> 8),bVar11)),
             CONCAT44(in_register_0000008c,bPhysId));
      return;
    }
  }
  swap();
  uVar5 = (uint)puVar6;
  if (uVar5 == bWorkId) {
    reassign();
LAB_0011ee0f:
    reassign();
LAB_0011ee14:
    reassign();
LAB_0011ee19:
    reassign();
LAB_0011ee1e:
    reassign();
LAB_0011ee23:
    reassign();
LAB_0011ee28:
    reassign();
LAB_0011ee2d:
    reassign();
  }
  else {
    if (extraout_EDX == 0xffffffff) goto LAB_0011ee0f;
    if ((this->_layout).workCount <= extraout_EDX) goto LAB_0011ee14;
    if (this->_workToPhysMap[extraout_EDX].physIds[0] != bWorkId) goto LAB_0011ee19;
    if (0x1f < bWorkId) goto LAB_0011ee1e;
    uVar7 = (ulong)pZVar10 & 0xffffffff;
    if (this->_physToWorkIds[uVar7][bWorkId] != extraout_EDX) goto LAB_0011ee23;
    if (3 < (uint)pZVar10) goto LAB_0011ee28;
    uVar8 = (this->_physToWorkMap->assigned)._masks[uVar7];
    uVar9 = 1 << ((byte)bWorkId & 0x1f);
    pZVar10 = (ZoneAllocator *)(ulong)uVar9;
    if ((uVar8 >> (bWorkId & 0x1f) & 1) == 0) goto LAB_0011ee2d;
    if (uVar5 < 0x20) {
      if ((uVar8 >> (uVar5 & 0x1f) & 1) == 0) {
        this->_workToPhysMap[extraout_EDX].physIds[0] = (byte)puVar6;
        puVar2 = this->_physToWorkIds[uVar7];
        puVar2[bWorkId] = 0xffffffff;
        puVar2[(ulong)puVar6 & 0xffffffff] = extraout_EDX;
        pPVar3 = this->_physToWorkMap;
        uVar5 = (pPVar3->dirty)._masks[uVar7];
        uVar9 = uVar9 | 1 << ((byte)puVar6 & 0x1f);
        puVar6 = (pPVar3->assigned)._masks + uVar7;
        *puVar6 = *puVar6 ^ uVar9;
        uVar8 = 0;
        if ((uVar5 >> (bWorkId & 0x1f) & 1) != 0) {
          uVar8 = uVar9;
        }
        (pPVar3->dirty)._masks[uVar7] = uVar8 ^ uVar5;
        verify(this,(EVP_PKEY_CTX *)(ulong)uVar9,(uchar *)(ulong)(uVar8 ^ uVar5),(ulong)uVar5,
               (uchar *)CONCAT44(in_register_00000084,bWorkId),uVar7);
        return;
      }
      goto LAB_0011ee37;
    }
  }
  reassign();
LAB_0011ee37:
  reassign();
  if ((ulong)*(uint *)this[1]._physToWorkIds != 0) {
    uVar7 = 0;
    do {
      if (*(ZoneAllocator **)(((this[1]._physToWorkMap)->assigned)._masks + uVar7 * 2) == pZVar10) {
        if (uVar7 != 0xffffffff) {
          return;
        }
        break;
      }
      uVar7 = uVar7 + 1;
    } while (*(uint *)this[1]._physToWorkIds != uVar7);
  }
  uVar5 = *(uint *)&pZVar10[1]._zone;
  if ((ulong)uVar5 != 0) {
    uVar7 = 0;
    do {
      if (*(RAAssignment **)((long)&pZVar10->_dynamicBlocks->prev + uVar7 * 8) == this) {
        if (uVar7 != 0xffffffff) {
          RABlock::appendSuccessor();
          allocator = pZVar10;
          this_02 = this;
          goto LAB_0011ef2b;
        }
        break;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  EVar4 = 0;
  allocator = pZVar10;
  this_02 = this;
  if (*(uint *)((long)(pZVar10 + 1) + 4) == uVar5) {
    this_02 = (RAAssignment *)&pZVar10->_dynamicBlocks;
    allocator = (ZoneAllocator *)((long)*(void **)&this->_layout + 0x18);
    EVar4 = ZoneVectorBase::_grow((ZoneVectorBase *)this_02,allocator,8,1);
  }
  if (EVar4 == 0) {
    EVar4 = 0;
    if (*(int *)((long)this[1]._physToWorkIds + 4) == *(int *)this[1]._physToWorkIds) {
      this_02 = (RAAssignment *)&this[1]._physToWorkMap;
      allocator = (ZoneAllocator *)((long)*(void **)&this->_layout + 0x18);
      EVar4 = ZoneVectorBase::_grow((ZoneVectorBase *)this_02,allocator,8,1);
    }
    if (EVar4 == 0) {
      if (*(uint *)this[1]._physToWorkIds < *(uint *)((long)this[1]._physToWorkIds + 4)) {
        *(ZoneAllocator **)
         (((this[1]._physToWorkMap)->assigned)._masks + (ulong)*(uint *)this[1]._physToWorkIds * 2)
             = pZVar10;
        *(int *)this[1]._physToWorkIds = *(int *)this[1]._physToWorkIds + 1;
        if (*(uint *)&pZVar10[1]._zone < *(uint *)((long)(pZVar10 + 1) + 4)) {
          *(RAAssignment **)
           ((long)&pZVar10->_dynamicBlocks->prev + (ulong)*(uint *)&pZVar10[1]._zone * 8) = this;
          *(int *)&pZVar10[1]._zone = *(int *)&pZVar10[1]._zone + 1;
          return;
        }
      }
      else {
LAB_0011ef2b:
        RABlock::appendSuccessor();
      }
      RABlock::appendSuccessor();
      if ((ulong)*(uint *)this_02[1]._physToWorkIds != 0) {
        uVar7 = 0;
        do {
          if (*(ZoneAllocator **)(((this_02[1]._physToWorkMap)->assigned)._masks + uVar7 * 2) ==
              allocator) {
            if (uVar7 != 0xffffffff) {
              return;
            }
            break;
          }
          uVar7 = uVar7 + 1;
        } while (*(uint *)this_02[1]._physToWorkIds != uVar7);
      }
      uVar5 = *(uint *)&allocator[1]._zone;
      if ((ulong)uVar5 != 0) {
        uVar7 = 0;
        do {
          if (*(RAAssignment **)((long)&allocator->_dynamicBlocks->prev + uVar7 * 8) == this_02) {
            if (uVar7 != 0xffffffff) {
              RABlock::prependSuccessor();
              this_03 = this_02;
              goto LAB_0011f060;
            }
            break;
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      this_00 = (ZoneVectorBase *)&allocator->_dynamicBlocks;
      EVar4 = 0;
      this_03 = this_02;
      if (*(uint *)((long)(allocator + 1) + 4) == uVar5) {
        this_03 = (RAAssignment *)this_00;
        EVar4 = ZoneVectorBase::_grow
                          (this_00,(ZoneAllocator *)((long)*(void **)&this_02->_layout + 0x18),8,1);
      }
      if (EVar4 == 0) {
        this_01 = &this_02[1]._physToWorkMap;
        EVar4 = 0;
        if (*(int *)((long)this_02[1]._physToWorkIds + 4) == *(int *)this_02[1]._physToWorkIds) {
          this_03 = (RAAssignment *)this_01;
          EVar4 = ZoneVectorBase::_grow
                            ((ZoneVectorBase *)this_01,
                             (ZoneAllocator *)((long)*(void **)&this_02->_layout + 0x18),8,1);
        }
        if (EVar4 == 0) {
          uVar5 = *(uint *)this_02[1]._physToWorkIds;
          if (uVar5 < *(uint *)((long)this_02[1]._physToWorkIds + 4)) {
            pPVar3 = *this_01;
            if ((ulong)uVar5 != 0) {
              this_03 = (RAAssignment *)((pPVar3->assigned)._masks + 2);
              memmove(this_03,pPVar3,(ulong)uVar5 << 3);
            }
            *(ZoneAllocator **)(pPVar3->assigned)._masks = allocator;
            *(int *)this_02[1]._physToWorkIds = *(int *)this_02[1]._physToWorkIds + 1;
            uVar5 = *(uint *)&allocator[1]._zone;
            if (uVar5 < *(uint *)((long)(allocator + 1) + 4)) {
              __src = (undefined8 *)this_00->_data;
              if ((ulong)uVar5 != 0) {
                memmove(__src + 1,__src,(ulong)uVar5 << 3);
              }
              *__src = this_02;
              *(int *)&allocator[1]._zone = *(int *)&allocator[1]._zone + 1;
              return;
            }
          }
          else {
LAB_0011f060:
            RABlock::prependSuccessor();
          }
          RABlock::prependSuccessor();
          FuncPass::FuncPass((FuncPass *)this_03,"BaseRAPass");
          *(undefined ***)&this_03->_layout = &PTR__BaseRAPass_00159868;
          this_03->_workToPhysMap = (WorkToPhysMap *)0x0;
          this_03->_physToWorkMap = (PhysToWorkMap *)0x0;
          this_03->_physToWorkIds[0] = (uint32_t *)0x0;
          this_03->_physToWorkIds[1] = (uint32_t *)0x0;
          this_03->_physToWorkIds[2] = (uint32_t *)0x0;
          this_03->_physToWorkIds[3] = (uint32_t *)0x0;
          this_03[1]._layout.physIndex = (RARegCount)0x0;
          this_03[1]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          this_03[1]._layout.physTotal = 0;
          this_03[1]._layout.workCount = 0;
          this_03[1]._layout.workRegs = (RAWorkRegs *)0x0;
          this_03[1]._workToPhysMap = (WorkToPhysMap *)0x0;
          this_03[1]._physToWorkMap = (PhysToWorkMap *)0x0;
          this_03[1]._physToWorkIds[0] = (uint32_t *)0x0;
          this_03[1]._physToWorkIds[1] = (uint32_t *)0x0;
          this_03[1]._physToWorkIds[2] = (uint32_t *)0x0;
          *(undefined8 *)((long)this_03[1]._physToWorkIds + 0x14) = 0;
          *(undefined8 *)((long)this_03[1]._physToWorkIds + 0x1c) = 0;
          *(undefined8 *)&this_03[2]._layout.physTotal = 0;
          this_03[2]._layout.workRegs = (RAWorkRegs *)0x0;
          this_03[2]._workToPhysMap = (WorkToPhysMap *)0x0;
          this_03[2]._physToWorkMap = (PhysToWorkMap *)0x0;
          this_03[2]._physToWorkIds[0] = (uint32_t *)0x0;
          this_03[2]._physToWorkIds[1] = (uint32_t *)0x0;
          this_03[2]._physToWorkIds[2] = (uint32_t *)0x0;
          this_03[2]._physToWorkIds[3] = (uint32_t *)0x0;
          this_03[3]._layout.physIndex = (RARegCount)0x0;
          this_03[3]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          this_03[3]._layout.physTotal = 0;
          this_03[3]._layout.workCount = 0;
          this_03[3]._layout.workRegs = (RAWorkRegs *)0x0;
          this_03[3]._workToPhysMap = (WorkToPhysMap *)0x0;
          this_03[3]._physToWorkMap = (PhysToWorkMap *)0x0;
          this_03[3]._physToWorkIds[0] = (uint32_t *)0x0;
          *(undefined8 *)((long)this_03[3]._physToWorkIds + 6) = 0;
          *(undefined8 *)((long)this_03[3]._physToWorkIds + 0xe) = 0;
          this_03[3]._physToWorkIds[3] = (uint32_t *)0x0;
          *(void **)&this_03[4]._layout = (void *)0x0;
          *(undefined8 *)&this_03[4]._layout.physTotal = 0;
          this_03[4]._layout.workRegs = (RAWorkRegs *)0x0;
          *(undefined4 *)&this_03[4]._workToPhysMap = 0;
          this_03[5]._workToPhysMap = (WorkToPhysMap *)0x0;
          this_03[5]._physToWorkMap = (PhysToWorkMap *)0x0;
          this_03[5]._layout.physTotal = 0;
          this_03[5]._layout.workCount = 0;
          this_03[5]._layout.workRegs = (RAWorkRegs *)0x0;
          this_03[4]._physToWorkIds[3] = (uint32_t *)0x0;
          this_03[5]._layout.physIndex = (RARegCount)0x0;
          this_03[5]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          this_03[4]._physToWorkIds[1] = (uint32_t *)0x0;
          this_03[4]._physToWorkIds[2] = (uint32_t *)0x0;
          this_03[4]._physToWorkMap = (PhysToWorkMap *)0x0;
          this_03[4]._physToWorkIds[0] = (uint32_t *)0x0;
          *(undefined4 *)this_03[5]._physToWorkIds = 0;
          *(undefined8 *)&this_03[6]._layout.physTotal = 0;
          this_03[6]._layout.workRegs = (RAWorkRegs *)0x0;
          this_03[5]._physToWorkIds[3] = (uint32_t *)0x0;
          *(void **)&this_03[6]._layout = (void *)0x0;
          *(undefined8 *)((long)this_03[5]._physToWorkIds + 4) = 0;
          *(undefined8 *)((long)this_03[5]._physToWorkIds + 0xc) = 0;
          this_03[6]._workToPhysMap = (WorkToPhysMap *)0x0;
          this_03[6]._physToWorkMap = (PhysToWorkMap *)0x0;
          this_03[6]._physToWorkIds[0] = (uint32_t *)0xff00000001;
          this_03[6]._physToWorkIds[1] = (uint32_t *)0x0;
          this_03[6]._physToWorkIds[2] = (uint32_t *)0xff00000001;
          this_03[7]._layout.physTotal = 0;
          this_03[7]._layout.workCount = 0;
          this_03[6]._physToWorkIds[3] = (uint32_t *)0x0;
          this_03[7]._layout.physIndex = (RARegCount)0x0;
          this_03[7]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          *(undefined4 *)&this_03[7]._layout.workRegs = 1;
          this_03[7]._physToWorkIds[0] = (uint32_t *)0x0;
          this_03[7]._workToPhysMap = (WorkToPhysMap *)0x0;
          this_03[7]._physToWorkMap = (PhysToWorkMap *)0x0;
          *(undefined1 *)(this_03[7]._physToWorkIds + 1) = 0xff;
          memset((void *)((long)this_03[7]._physToWorkIds + 9),0,0x103);
          this_03[0xb]._workToPhysMap = (WorkToPhysMap *)0x0;
          this_03[0xb]._physToWorkMap = (PhysToWorkMap *)0x0;
          this_03[0xb]._physToWorkIds[0] = (uint32_t *)0x0;
          this_03[0xb]._physToWorkIds[1] = (uint32_t *)0x0;
          *(undefined1 *)&this_03[0xb]._physToWorkMap = 0x20;
          this_03[0xb]._physToWorkIds[1] = (uint32_t *)0x57;
          this_03[0xb]._physToWorkIds[2] = (uint32_t *)(this_03[0xb]._physToWorkIds + 3);
          *(undefined1 *)(this_03[0xb]._physToWorkIds + 3) = 0;
          return;
        }
      }
      return;
    }
  }
  return;
}

Assistant:

ASMJIT_INLINE void swap(uint32_t group, uint32_t aWorkId, uint32_t aPhysId, uint32_t bWorkId, uint32_t bPhysId) noexcept {
    ASMJIT_ASSERT(aPhysId != bPhysId);
    ASMJIT_ASSERT(workToPhysId(group, aWorkId) == aPhysId);
    ASMJIT_ASSERT(workToPhysId(group, bWorkId) == bPhysId);
    ASMJIT_ASSERT(physToWorkId(group, aPhysId) == aWorkId);
    ASMJIT_ASSERT(physToWorkId(group, bPhysId) == bWorkId);
    ASMJIT_ASSERT(isPhysAssigned(group, aPhysId));
    ASMJIT_ASSERT(isPhysAssigned(group, bPhysId));

    _workToPhysMap->physIds[aWorkId] = uint8_t(bPhysId);
    _workToPhysMap->physIds[bWorkId] = uint8_t(aPhysId);
    _physToWorkIds[group][aPhysId] = bWorkId;
    _physToWorkIds[group][bPhysId] = aWorkId;

    uint32_t aMask = Support::bitMask(aPhysId);
    uint32_t bMask = Support::bitMask(bPhysId);

    uint32_t flipMask = Support::bitMaskFromBool<uint32_t>(
      ((_physToWorkMap->dirty[group] & aMask) != 0) ^
      ((_physToWorkMap->dirty[group] & bMask) != 0));

    uint32_t regMask = aMask | bMask;
    _physToWorkMap->dirty[group] ^= regMask & flipMask;

    verify();
  }